

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O0

wchar_t adjust_dam(player *p,wchar_t type,wchar_t dam,_Bool actual)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  int iVar4;
  uint32_t uVar5;
  wchar_t local_38;
  wchar_t range;
  wchar_t max_range;
  wchar_t special_dam;
  wchar_t dam_percent;
  _Bool actual_local;
  wchar_t dam_local;
  wchar_t type_local;
  player *p_local;
  
  max_range = L'd';
  if ((p != (player *)0x0) && (p->race != (player_race *)0x0)) {
    if (type == L'\x0e') {
      wVar2 = adjust_dam(p,L'\x03',dam,actual);
      return wVar2;
    }
    if (type == L'\x13') {
      wVar2 = adjust_dam(p,L'\x02',dam / 2,actual);
      wVar3 = adjust_dam(p,L'\x01',dam / 2,actual);
      return wVar3 + wVar2;
    }
    if (type == L'\x14') {
      return dam / 2;
    }
    if (type == L'\x15') {
      wVar2 = adjust_dam(p,L'\x02',dam / 2,actual);
      wVar3 = adjust_dam(p,L'\x04',dam / 2,actual);
      return wVar3 + wVar2;
    }
    if (type == L'\x16') {
      wVar2 = adjust_dam(p,L'\x02',(dam << 1) / 3,actual);
      wVar3 = adjust_dam(p,L'\x06',dam / 3,actual);
      return wVar3 + wVar2;
    }
    if ((type < L'\x1c') && (max_range = (wchar_t)(p->state).el_info[type].res_level, actual)) {
      equip_learn_element(p,type);
    }
  }
  if (max_range == L'\0') {
    p_local._4_4_ = L'\0';
  }
  else {
    dam_percent = dam;
    if (((type == L'\0') && (p != (player *)0x0)) && (_Var1 = minus_ac(p), _Var1)) {
      dam_percent = (dam + L'\x01') / 2;
    }
    if ((L'\x03' < type) && (max_range < L'e')) {
      if (max_range < L'3') {
        local_38 = max_range;
      }
      else {
        local_38 = L'd' - max_range;
      }
      iVar4 = 1;
      if (type == L'\v') {
        iVar4 = 2;
      }
      iVar4 = (iVar4 * local_38) / 10;
      uVar5 = Rand_div(iVar4 * 2 + 1);
      max_range = (max_range - iVar4) + uVar5;
    }
    p_local._4_4_ = (dam_percent * max_range + 99) / 100;
  }
  return p_local._4_4_;
}

Assistant:

int adjust_dam(struct player *p, int type, int dam, bool actual)
{
	int dam_percent = 100;

	/* If an actual player exists, get their actual resist */
	if (p && p->race) {
		int special_dam = 0;

		/* Handle special cases */
		if (type == PROJ_ICE) {
			return adjust_dam(p, PROJ_COLD, dam, actual);
		} else if (type == PROJ_PLASMA) {
			special_dam = adjust_dam(p, PROJ_FIRE, dam / 2, actual);
			special_dam += adjust_dam(p, PROJ_ELEC, dam / 2, actual);
			return special_dam;
		} else if (type == PROJ_STORM) {
			/* Extra storm damage will come later */
			return dam / 2;
		} else if (type == PROJ_DRAGONFIRE) {
			special_dam = adjust_dam(p, PROJ_FIRE, dam / 2, actual);
			special_dam += adjust_dam(p, PROJ_POIS, dam / 2, actual);
			return special_dam;
		} else if (type == PROJ_HELLFIRE) {
			special_dam = adjust_dam(p, PROJ_FIRE, 2 * dam / 3, actual);
			special_dam += adjust_dam(p, PROJ_DARK, dam / 3, actual);
			return special_dam;
		} else if (type < ELEM_MAX) {
			/* For the regular elements, the stored resistance level is the
			 * percentage of damage taken */
			dam_percent = p->state.el_info[type].res_level;

			/* Notice element stuff */
			if (actual) {
				equip_learn_element(p, type);
			}
		}
	}

	/* Immune */
	if (dam_percent == RES_LEVEL_MAX) return 0;

	/* Acid damage is halved by armour */
	if (type == PROJ_ACID && p && minus_ac(p)) {
		dam = (dam + 1) / 2;
	}

	/* High resists get randomised, especially chaos */
	if ((type >= ELEM_HIGH_MIN) && (dam_percent <= RES_LEVEL_BASE)) {
		/* How far is the closer of zero and 100 */
		int max_range =	dam_percent > 50 ? 100 - dam_percent : dam_percent;

		/* Random range is 1 or 2 times 10% of that range */
		int range = (((type == PROJ_CHAOS) ? 2 : 1) * max_range) / 10;

		/* Randomize */
		dam_percent = dam_percent - range + randint0((2 * range) + 1);
	}

	/* Apply the percentage resistance, rounded up */
	return ((dam * dam_percent) + 99) / 100;
}